

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDependence.h
# Opt level: O3

void __thiscall
dg::dda::LLVMDataDependenceAnalysis::LLVMDataDependenceAnalysis
          (LLVMDataDependenceAnalysis *this,Module *m,LLVMPointerAnalysis *pta,
          LLVMDataDependenceAnalysisOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  UndefinedFunsBehavior UVar5;
  LLVMReadWriteGraphBuilder *pLVar6;
  
  this->m = m;
  this->pta = pta;
  paVar1 = &(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2;
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p;
  paVar2 = &(opts->super_LLVMAnalysisOptions).entryFunction.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(opts->super_LLVMAnalysisOptions).entryFunction.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_options).super_LLVMAnalysisOptions.entryFunction.field_2 + 8) =
         uVar4;
  }
  else {
    (this->_options).super_LLVMAnalysisOptions.entryFunction._M_dataplus._M_p = pcVar3;
    (this->_options).super_LLVMAnalysisOptions.entryFunction.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (this->_options).super_LLVMAnalysisOptions.entryFunction._M_string_length =
       (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_dataplus._M_p = (pointer)paVar2;
  (opts->super_LLVMAnalysisOptions).entryFunction._M_string_length = 0;
  (opts->super_LLVMAnalysisOptions).entryFunction.field_2._M_local_buf[0] = '\0';
  (this->_options).super_DataDependenceAnalysisOptions.super_AnalysisOptions.fieldSensitivity.offset
       = (opts->super_DataDependenceAnalysisOptions).super_AnalysisOptions.fieldSensitivity.offset;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_options).super_DataDependenceAnalysisOptions.super_AnalysisOptions.
              allocationFunctions._M_t._M_impl.super__Rb_tree_header,
             &(opts->super_DataDependenceAnalysisOptions).super_AnalysisOptions.allocationFunctions.
              _M_t._M_impl.super__Rb_tree_header);
  (this->_options).super_DataDependenceAnalysisOptions.fieldInsensitive =
       (opts->super_DataDependenceAnalysisOptions).fieldInsensitive;
  UVar5 = (opts->super_DataDependenceAnalysisOptions).undefinedFunsBehavior;
  (this->_options).super_DataDependenceAnalysisOptions.analysisType =
       (opts->super_DataDependenceAnalysisOptions).analysisType;
  (this->_options).super_DataDependenceAnalysisOptions.undefinedFunsBehavior = UVar5;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_options).super_DataDependenceAnalysisOptions.functionModels._M_t._M_impl.
              super__Rb_tree_header,
             &(opts->super_DataDependenceAnalysisOptions).functionModels._M_t._M_impl.
              super__Rb_tree_header);
  (this->_options).threads = opts->threads;
  pLVar6 = (LLVMReadWriteGraphBuilder *)dg::dda::LLVMDataDependenceAnalysis::createBuilder();
  this->builder = pLVar6;
  (this->DDA)._M_t.
  super___uniq_ptr_impl<dg::dda::DataDependenceAnalysis,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_dg::dda::DataDependenceAnalysis_*,_std::default_delete<dg::dda::DataDependenceAnalysis>_>
  .super__Head_base<0UL,_dg::dda::DataDependenceAnalysis_*,_false>._M_head_impl =
       (DataDependenceAnalysis *)0x0;
  return;
}

Assistant:

LLVMDataDependenceAnalysis(const llvm::Module *m,
                               dg::LLVMPointerAnalysis *pta,
                               LLVMDataDependenceAnalysisOptions opts = {})
            : m(m), pta(pta), _options(std::move(opts)),
              builder(createBuilder()) {}